

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclCache.cpp
# Opt level: O3

void xmrig::OclCache::save(cl_program program,string *fileName)

{
  cl_int cVar1;
  size_t size;
  vector<char,_std::allocator<char>_> binary;
  char *data;
  ofstream file_stream;
  size_type local_240;
  vector<char,_std::allocator<char>_> local_238;
  pointer local_220;
  long local_218;
  filebuf local_210 [240];
  ios_base local_120 [264];
  
  local_240 = 0;
  cVar1 = OclLib::getProgramInfo(program,0x1165,8,&local_240,(size_t *)0x0);
  if (cVar1 == 0) {
    std::vector<char,_std::allocator<char>_>::vector
              (&local_238,local_240,(allocator_type *)&local_218);
    local_220 = local_238.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
    cVar1 = OclLib::getProgramInfo(program,0x1166,8,&local_220,(size_t *)0x0);
    if (cVar1 == 0) {
      createDirectory();
      std::ofstream::ofstream(&local_218);
      std::ofstream::open((string *)&local_218,(_Ios_Openmode)fileName);
      std::ostream::write((char *)&local_218,
                          (long)local_238.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
      std::ofstream::close();
      local_218 = _VTT;
      *(undefined8 *)(local_210 + *(long *)(_VTT + -0x18) + -8) = _operator_delete__;
      std::filebuf::~filebuf(local_210);
      std::ios_base::~ios_base(local_120);
    }
    if (local_238.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_238.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void xmrig::OclCache::save(cl_program program, const std::string &fileName)
{
    size_t size = 0;
    if (OclLib::getProgramInfo(program, CL_PROGRAM_BINARY_SIZES, sizeof(size), &size) != CL_SUCCESS) {
        return;
    }

    std::vector<char> binary(size);

    char *data = binary.data();
    if (OclLib::getProgramInfo(program, CL_PROGRAM_BINARIES, sizeof(char *), &data) != CL_SUCCESS) {
        return;
    }

    createDirectory();

    std::ofstream file_stream;
    file_stream.open(fileName, std::ofstream::out | std::ofstream::binary);
    file_stream.write(binary.data(), static_cast<int64_t>(binary.size()));
    file_stream.close();
}